

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O2

void __thiscall cbtTaskSchedulerDefault::cbtTaskSchedulerDefault(cbtTaskSchedulerDefault *this)

{
  cbtITaskScheduler::cbtITaskScheduler(&this->super_cbtITaskScheduler,"ThreadSupport");
  (this->super_cbtITaskScheduler)._vptr_cbtITaskScheduler =
       (_func_int **)&PTR__cbtTaskSchedulerDefault_01197df0;
  (this->m_jobQueues).m_ownsMemory = true;
  (this->m_jobQueues).m_data = (JobQueue *)0x0;
  (this->m_jobQueues).m_size = 0;
  (this->m_jobQueues).m_capacity = 0;
  (this->m_perThreadJobQueues).m_ownsMemory = true;
  (this->m_perThreadJobQueues).m_data = (JobQueue **)0x0;
  (this->m_perThreadJobQueues).m_size = 0;
  (this->m_perThreadJobQueues).m_capacity = 0;
  (this->m_threadLocalStorage).m_ownsMemory = true;
  (this->m_threadLocalStorage).m_data = (ThreadLocalStorage *)0x0;
  (this->m_threadLocalStorage).m_size = 0;
  (this->m_threadLocalStorage).m_capacity = 0;
  (this->m_antiNestingLock).mLock = 0;
  cbtClock::cbtClock(&this->m_clock);
  this->m_threadSupport = (cbtThreadSupportInterface *)0x0;
  this->m_workerDirective = (WorkerThreadDirectives *)0x0;
  return;
}

Assistant:

cbtTaskSchedulerDefault() : cbtITaskScheduler("ThreadSupport")
	{
		m_threadSupport = NULL;
		m_workerDirective = NULL;
	}